

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_reverse(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  uint uVar5;
  undefined1 *puVar6;
  undefined4 *puVar7;
  undefined8 *puVar8;
  undefined2 *puVar9;
  undefined1 *puVar10;
  undefined4 *puVar11;
  undefined8 *puVar12;
  undefined2 *puVar13;
  int64_t iVar14;
  JSValueUnion JVar15;
  JSRefCountHeader *p;
  JSValue JVar16;
  
  iVar14 = this_val.tag;
  JVar15 = this_val.u;
  uVar5 = js_typed_array_get_length_internal(ctx,this_val);
  if ((int)uVar5 < 0) {
    iVar14 = 6;
    JVar15.float64 = 0.0;
  }
  else {
    if (uVar5 != 0) {
      switch("includes"[(ulong)*(ushort *)((long)JVar15.ptr + 6) + 1]) {
      case '\0':
        puVar10 = *(undefined1 **)((long)JVar15.ptr + 0x38);
        puVar6 = puVar10 + uVar5;
        for (; puVar6 = puVar6 + -1, puVar10 < puVar6; puVar10 = puVar10 + 1) {
          uVar1 = *puVar10;
          *puVar10 = *puVar6;
          *puVar6 = uVar1;
        }
        break;
      case '\x01':
        puVar13 = *(undefined2 **)((long)JVar15.ptr + 0x38);
        puVar9 = puVar13 + uVar5;
        for (; puVar9 = puVar9 + -1, puVar13 < puVar9; puVar13 = puVar13 + 1) {
          uVar2 = *puVar13;
          *puVar13 = *puVar9;
          *puVar9 = uVar2;
        }
        break;
      case '\x02':
        puVar11 = *(undefined4 **)((long)JVar15.ptr + 0x38);
        puVar7 = puVar11 + uVar5;
        for (; puVar7 = puVar7 + -1, puVar11 < puVar7; puVar11 = puVar11 + 1) {
          uVar3 = *puVar11;
          *puVar11 = *puVar7;
          *puVar7 = uVar3;
        }
        break;
      case '\x03':
        puVar12 = *(undefined8 **)((long)JVar15.ptr + 0x38);
        puVar8 = puVar12 + uVar5;
        for (; puVar8 = puVar8 + -1, puVar12 < puVar8; puVar12 = puVar12 + 1) {
          uVar4 = *puVar12;
          *puVar12 = *puVar8;
          *puVar8 = uVar4;
        }
        break;
      default:
        abort();
      }
    }
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)JVar15.ptr = *JVar15.ptr + 1;
    }
  }
  JVar16.tag = iVar14;
  JVar16.u.ptr = JVar15.ptr;
  return JVar16;
}

Assistant:

static JSValue js_typed_array_reverse(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    JSObject *p;
    int len;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        return JS_EXCEPTION;
    if (len > 0) {
        p = JS_VALUE_GET_OBJ(this_val);
        switch (typed_array_size_log2(p->class_id)) {
        case 0:
            {
                uint8_t *p1 = p->u.array.u.uint8_ptr;
                uint8_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint8_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        case 1:
            {
                uint16_t *p1 = p->u.array.u.uint16_ptr;
                uint16_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint16_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        case 2:
            {
                uint32_t *p1 = p->u.array.u.uint32_ptr;
                uint32_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint32_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        case 3:
            {
                uint64_t *p1 = p->u.array.u.uint64_ptr;
                uint64_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint64_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        default:
            abort();
        }
    }
    return JS_DupValue(ctx, this_val);
}